

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O3

fdb_status
fdb_set_block_reusing_params
          (fdb_file_handle *fhandle,size_t block_reusing_threshold,size_t num_keeping_headers)

{
  filemgr *pfVar1;
  fdb_status fVar2;
  
  fVar2 = FDB_RESULT_INVALID_HANDLE;
  if ((fhandle != (fdb_file_handle *)0x0) && (fhandle->root != (fdb_kvs_handle *)0x0)) {
    pfVar1 = fhandle->root->file;
    (pfVar1->config->block_reusing_threshold).super___atomic_base<unsigned_long>._M_i =
         block_reusing_threshold;
    (pfVar1->config->num_keeping_headers).super___atomic_base<unsigned_long>._M_i =
         num_keeping_headers;
    fVar2 = FDB_RESULT_SUCCESS;
  }
  return fVar2;
}

Assistant:

LIBFDB_API
fdb_status fdb_set_block_reusing_params(fdb_file_handle *fhandle,
                                        size_t block_reusing_threshold,
                                        size_t num_keeping_headers)
{
    if (!fhandle || !fhandle->root) {
        return FDB_RESULT_INVALID_HANDLE;
    }
    filemgr *file = fhandle->root->file;
    atomic_store_uint64_t(&file->config->block_reusing_threshold,
                          block_reusing_threshold, std::memory_order_relaxed);
    atomic_store_uint64_t(&file->config->num_keeping_headers, num_keeping_headers,
                          std::memory_order_relaxed);
    return FDB_RESULT_SUCCESS;
}